

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_true>::ControlPacket
          (ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_true> *this)

{
  ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_true> *this_local;
  
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0014fd30;
  ControlPacketSerializableImpl::ControlPacketSerializableImpl
            (&this->super_ControlPacketSerializableImpl,&(this->header).super_FixedHeaderBase,
             &(this->fixedVariableHeader).super_FixedFieldGeneric,
             &(this->props).super_SerializableProperties,&(this->payload).super_SerializablePayload)
  ;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0014fd30;
  FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)'\x00'>::
  FixedHeaderType(&this->header,'\0');
  FixedField<(Protocol::MQTT::Common::ControlPacketType)3>::FixedField(&this->fixedVariableHeader);
  PropertiesView::PropertiesView(&this->props);
  PayloadWithData<false>::PayloadWithData(&this->payload);
  SerializablePayload::setFlags
            (&(this->payload).super_SerializablePayload,
             &(this->fixedVariableHeader).super_FixedFieldGeneric);
  FixedField<(Protocol::MQTT::Common::ControlPacketType)3>::setFlags
            (&this->fixedVariableHeader,&(this->header).super_FixedHeaderBase.typeAndFlags);
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }